

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O2

bool __thiscall
VertexAttrib64Bit::GetVertexAttribTest::verifyResults
          (GetVertexAttribTest *this,GLuint index,GLenum pname,GLint expected_value)

{
  ostringstream *poVar1;
  TestLog *pTVar2;
  GLint GVar3;
  GLenum GVar4;
  char *pcVar5;
  size_t __n;
  void *__buf;
  GLint params_getVertexAttribiv;
  GLdouble params_getVertexAttribLdv;
  allocator<char> local_20a;
  allocator<char> local_209;
  GLuint local_208;
  GLenum local_204;
  GLint local_200;
  GLint local_1fc;
  GLdouble local_1f8;
  string local_1f0;
  string local_1d0;
  undefined1 local_1b0 [384];
  
  local_1fc = 0;
  local_1f8 = 0.0;
  local_200 = expected_value;
  (*(this->super_Base).gl.getVertexAttribiv)(index,pname,&local_1fc);
  GVar4 = (*(this->super_Base).gl.getError)();
  glu::checkError(GVar4,"GetVertexAttribiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0x448);
  local_208 = index;
  local_204 = pname;
  (*(this->super_Base).gl.getVertexAttribLdv)(index,pname,&local_1f8);
  GVar4 = (*(this->super_Base).gl.getError)();
  GVar3 = local_200;
  __n = 1099;
  glu::checkError(GVar4,"GetVertexAttribLdv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,1099);
  if (local_1fc == GVar3) {
    if ((local_1f8 == (double)GVar3) && (!NAN(local_1f8) && !NAN((double)GVar3))) {
      return true;
    }
  }
  pTVar2 = (this->super_Base).m_log;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"Error",&local_209);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0,glcts::fixed_sample_locations_values + 1,&local_20a);
  GVar4 = local_204;
  tcu::LogSection::LogSection((LogSection *)local_1b0,&local_1d0,&local_1f0);
  tcu::LogSection::write((LogSection *)local_1b0,(int)pTVar2,__buf,__n);
  tcu::LogSection::~LogSection((LogSection *)local_1b0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  local_1b0._0_8_ = (this->super_Base).m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"GetVertexAttribiv(");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<((ostream *)poVar1,"/* index */, ");
  pcVar5 = glu::getVertexAttribParameterNameName(GVar4);
  std::operator<<((ostream *)poVar1,pcVar5);
  std::operator<<((ostream *)poVar1,"/* pname */)");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  local_1b0._0_8_ = (this->super_Base).m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Result: ");
  std::ostream::operator<<(poVar1,local_1fc);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  local_1b0._0_8_ = (this->super_Base).m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"GetVertexAttribLdv(");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<((ostream *)poVar1,"/* index */, ");
  pcVar5 = glu::getVertexAttribParameterNameName(GVar4);
  std::operator<<((ostream *)poVar1,pcVar5);
  std::operator<<((ostream *)poVar1,"/* pname */)");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  local_1b0._0_8_ = (this->super_Base).m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Result: ");
  std::ostream::_M_insert<double>(local_1f8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  local_1b0._0_8_ = (this->super_Base).m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Expected: ");
  std::ostream::operator<<(poVar1,GVar3);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  local_1b0._0_8_ = (this->super_Base).m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"File: ");
  std::operator<<((ostream *)poVar1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                 );
  std::operator<<((ostream *)poVar1,"@");
  std::ostream::operator<<(poVar1,0x45d);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  tcu::TestLog::endSection((this->super_Base).m_log);
  return false;
}

Assistant:

bool GetVertexAttribTest::verifyResults(GLuint index, GLenum pname, GLint expected_value) const
{
	GLint	params_getVertexAttribiv  = 0;
	GLdouble params_getVertexAttribLdv = 0.0;

	gl.getVertexAttribiv(index, pname, &params_getVertexAttribiv);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetVertexAttribiv");

	gl.getVertexAttribLdv(index, pname, &params_getVertexAttribLdv);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetVertexAttribLdv");

	if ((expected_value != params_getVertexAttribiv) || (expected_value != params_getVertexAttribLdv))
	{
		m_log << tcu::TestLog::Section("Error", "");

		m_log << tcu::TestLog::Message << "GetVertexAttribiv(" << index << "/* index */, "
			  << glu::getVertexAttribParameterNameName(pname) << "/* pname */)" << tcu::TestLog::EndMessage;

		m_log << tcu::TestLog::Message << "Result: " << params_getVertexAttribiv << tcu::TestLog::EndMessage;

		m_log << tcu::TestLog::Message << "GetVertexAttribLdv(" << index << "/* index */, "
			  << glu::getVertexAttribParameterNameName(pname) << "/* pname */)" << tcu::TestLog::EndMessage;

		m_log << tcu::TestLog::Message << "Result: " << params_getVertexAttribLdv << tcu::TestLog::EndMessage;

		m_log << tcu::TestLog::Message << "Expected: " << expected_value << tcu::TestLog::EndMessage;

		m_log << tcu::TestLog::Message << "File: " << __FILE__ << "@" << __LINE__ << tcu::TestLog::EndMessage;

		m_log << tcu::TestLog::EndSection;

		return false;
	}

	return true;
}